

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O2

Node * __thiscall Analyzer::extractAssignedExpression(Analyzer *this,Node *node)

{
  NodeType NVar1;
  TokenType TVar2;
  ulong uVar3;
  pointer ppNVar4;
  pointer ppNVar5;
  
  do {
    NVar1 = node->nodeType;
    uVar3 = (ulong)NVar1;
    if (0x3c < uVar3) {
      return (Node *)0x0;
    }
    if ((0x1800000040000100U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 != 0x1d) {
        if (uVar3 != 0xf) {
          return (Node *)0x0;
        }
LAB_00120019:
        TVar2 = node->tok->type;
        if ((TVar2 != TK_NEWSLOT) && (TVar2 != TK_ASSIGN)) {
          return (Node *)0x0;
        }
        return (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      }
      ppNVar4 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar5 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    else {
      ppNVar4 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppNVar5 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((8 < (ulong)((long)ppNVar5 - (long)ppNVar4)) && (ppNVar4[1] != (Node *)0x0)) {
        return ppNVar4[1];
      }
      if (NVar1 != PNT_LOCAL_VAR_DECLARATION) {
        if (NVar1 != PNT_BINARY_OP) {
          return (Node *)0x0;
        }
        goto LAB_00120019;
      }
    }
    if (ppNVar5 == ppNVar4) {
      return (Node *)0x0;
    }
    node = *ppNVar4;
  } while( true );
}

Assistant:

Node * extractAssignedExpression(Node * node)
  {
    if (node->nodeType == PNT_KEY_VALUE || node->nodeType == PNT_CLASS_MEMBER || node->nodeType == PNT_STATIC_CLASS_MEMBER ||
      node->nodeType == PNT_VAR_DECLARATOR)
    {
      if (node->children.size() > 1 && node->children[1])
        return node->children[1];
    }

    if (node->nodeType == PNT_BINARY_OP && (node->tok.type == TK_NEWSLOT || node->tok.type == TK_ASSIGN))
      return node->children[1];

    if (node->nodeType == PNT_LOCAL_VAR_DECLARATION && node->children.size() > 0)
      return extractAssignedExpression(node->children[0]);

    return nullptr;
  }